

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ColumnRefExpression *col_ref_p,
          idx_t depth,bool root_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  DummyBinding *pDVar4;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var5;
  BindingMode BVar6;
  int iVar7;
  BoundConstantExpression *this_00;
  pointer pPVar8;
  BaseExpression *this_01;
  string *psVar9;
  pointer pEVar10;
  Binder *pBVar11;
  undefined1 auVar12 [8];
  ColumnRefExpression *pCVar13;
  bool bVar14;
  BoundColumnReferenceInfo ref;
  ErrorData error;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_1f0;
  long *local_1e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1e0;
  ColumnRefExpression *local_1d8;
  undefined1 local_1d0 [8];
  element_type *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  Val local_1b0;
  _Alloc_hider local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_180 [56];
  LogicalType local_148;
  undefined1 local_130 [128];
  undefined1 local_b0 [128];
  
  BVar6 = Binder::GetBindingMode(this->binder);
  if (BVar6 == EXTRACT_NAMES) {
    LogicalType::LogicalType(&local_148,SQLNULL);
    Value::Value((Value *)local_130,&local_148);
    this_00 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_1d0,(Value *)local_130);
    BoundConstantExpression::BoundConstantExpression(this_00,(Value *)local_1d0);
    Value::~Value((Value *)local_1d0);
    local_1e0._M_head_impl = (Expression *)this_00;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1e0);
    if ((BoundConstantExpression *)local_1e0._M_head_impl != (BoundConstantExpression *)0x0) {
      (*(((Expression *)&(local_1e0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_1e0._M_head_impl = (Expression *)0x0;
    Value::~Value((Value *)local_130);
    LogicalType::~LogicalType(&local_148);
    return __return_storage_ptr__;
  }
  ErrorData::ErrorData((ErrorData *)local_130);
  (*this->_vptr_ExpressionBinder[2])(&local_1f0,this,col_ref_p,(ErrorData *)local_130);
  if (local_1f0._M_head_impl == (ParsedExpression *)0x0) {
    bVar14 = ColumnRefExpression::IsQualified(col_ref_p);
    if (!bVar14) {
      BindResult::BindResult((BindResult *)local_1d0);
      iVar7 = (*this->_vptr_ExpressionBinder[3])(this,col_ref_p,root_expression,local_1d0);
      peVar2 = local_1c8;
      if ((char)iVar7 != '\0') {
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)local_1d0;
        local_1d0 = (undefined1  [8])0x0;
        (__return_storage_ptr__->error).initialized = local_1c8._0_1_;
        (__return_storage_ptr__->error).type = local_1c8._1_1_;
        paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
        if ((Val *)local_1c0._M_allocated_capacity == &local_1b0) {
          *(int32_t *)paVar1 = local_1b0.integer;
          *(int32_t *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
               local_1b0.interval.days;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
               local_1b0.hugeint.upper._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
               local_1b0.hugeint.upper._4_4_;
        }
        else {
          (__return_storage_ptr__->error).raw_message._M_dataplus._M_p =
               (pointer)local_1c0._M_allocated_capacity;
          (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
               local_1b0.bigint;
        }
        (__return_storage_ptr__->error).raw_message._M_string_length = local_1c0._8_8_;
        local_1c0._8_8_ = 0;
        local_1b0.ubigint = local_1b0.ubigint & 0xffffffffffffff00;
        paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_p == &local_190) {
          *(undefined4 *)paVar1 = local_190._M_allocated_capacity._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
               local_190._M_allocated_capacity._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
               local_190._8_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
               local_190._12_4_;
        }
        else {
          (__return_storage_ptr__->error).final_message._M_dataplus._M_p = local_1a0._M_p;
          (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
               CONCAT44(local_190._M_allocated_capacity._4_4_,local_190._M_allocated_capacity._0_4_)
          ;
        }
        (__return_storage_ptr__->error).final_message._M_string_length = (size_type)local_198._M_pi;
        local_198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_190._M_allocated_capacity._0_4_ = local_190._M_allocated_capacity._0_4_ & 0xffffff00;
        local_1c8 = peVar2;
        local_1c0._M_allocated_capacity = (size_type)&local_1b0;
        local_1a0._M_p = (pointer)&local_190;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(__return_storage_ptr__->error).extra_info,local_180);
LAB_0119f840:
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_p != &local_190) {
          operator_delete(local_1a0._M_p);
        }
        if ((Val *)local_1c0._M_allocated_capacity != &local_1b0) {
          operator_delete((void *)local_1c0._M_allocated_capacity);
        }
        if (local_1d0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1d0 + 8))();
        }
        goto LAB_0119f76d;
      }
      iVar7 = (*this->_vptr_ExpressionBinder[4])(this,col_ref_p);
      if ((char)iVar7 == '\0') {
        psVar9 = ColumnRefExpression::GetColumnName_abi_cxx11_(col_ref_p);
        (*this->_vptr_ExpressionBinder[6])(&local_1e8,this,psVar9);
        if (local_1e8 != (long *)0x0) {
          (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_1e8,depth,0);
          if (local_1e8 != (long *)0x0) {
            (**(code **)(*local_1e8 + 8))();
          }
          goto LAB_0119f840;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p);
      }
      if ((Val *)local_1c0._M_allocated_capacity != &local_1b0) {
        operator_delete((void *)local_1c0._M_allocated_capacity);
      }
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1d0 + 8))();
      }
    }
    ErrorData::AddQueryLocation((ErrorData *)local_130,&col_ref_p->super_ParsedExpression);
    local_b0._0_2_ = local_130._0_2_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_130 + 0x18)) {
      local_b0._32_4_ = local_130._32_4_;
      local_b0._36_4_ = local_130._36_4_;
      local_b0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_b0 + 0x18);
    }
    else {
      local_b0._8_8_ = local_130._8_8_;
    }
    local_b0._16_8_ = local_130._16_8_;
    local_130._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_130._24_4_ = local_130._24_4_ & 0xffffff00;
    if ((undefined1 *)local_130._40_8_ == local_130 + 0x38) {
      local_b0._64_4_ = local_130._64_4_;
      local_b0._68_4_ = local_130._68_4_;
      local_b0._40_8_ = local_b0 + 0x38;
    }
    else {
      local_b0._40_8_ = local_130._40_8_;
    }
    local_b0._48_8_ = local_130._48_8_;
    local_130._48_8_ = (element_type *)0x0;
    local_130._56_4_ = local_130._56_4_ & 0xffffff00;
    local_130._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_130 + 0x18);
    local_130._40_8_ = local_130 + 0x38;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_130 + 0x48);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    auVar12 = (undefined1  [8])local_b0._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b0 + 0x18)) goto LAB_0119f76d;
  }
  else {
    pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_1f0);
    (pPVar8->super_BaseExpression).query_location.index =
         (col_ref_p->super_ParsedExpression).super_BaseExpression.query_location.index;
    pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_1f0);
    if ((pPVar8->super_BaseExpression).type == COLUMN_REF) {
      BindResult::BindResult(__return_storage_ptr__);
      this_01 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&local_1f0)->super_BaseExpression;
      local_1d8 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_01);
      psVar9 = ColumnRefExpression::GetTableName_abi_cxx11_(local_1d8);
      pBVar11 = this->binder;
      if ((pBVar11->macro_binding).ptr == (DummyBinding *)0x0) {
LAB_0119f64a:
        pCVar13 = local_1d8;
        BindContext::BindColumn((BindResult *)local_1d0,&pBVar11->bind_context,local_1d8,depth);
        auVar12 = local_1d0;
        local_1d0 = (undefined1  [8])0x0;
        _Var5.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (__return_storage_ptr__->expression).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)auVar12;
        if (_Var5.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (Expression *)0x0) {
          (**(code **)(*(long *)_Var5.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                _M_head_impl + 8))();
        }
        peVar2 = local_1c8;
        (__return_storage_ptr__->error).initialized = local_1c8._0_1_;
        (__return_storage_ptr__->error).type = local_1c8._1_1_;
        local_1c8 = peVar2;
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).raw_message,
                   (string *)local_1c0._M_local_buf);
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).final_message,(string *)&local_1a0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&(__return_storage_ptr__->error).extra_info,local_180);
      }
      else {
        optional_ptr<duckdb::DummyBinding,_true>::CheckValid(&pBVar11->macro_binding);
        Binding::GetAlias_abi_cxx11_
                  ((string *)local_1d0,&((pBVar11->macro_binding).ptr)->super_Binding);
        auVar12 = local_1d0;
        peVar2 = (element_type *)psVar9->_M_string_length;
        if (peVar2 == local_1c8) {
          if (peVar2 == (element_type *)0x0) {
            bVar14 = true;
          }
          else {
            iVar7 = bcmp((psVar9->_M_dataplus)._M_p,(void *)local_1d0,(size_t)peVar2);
            bVar14 = iVar7 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if (auVar12 != (undefined1  [8])&local_1c0) {
          operator_delete((void *)auVar12);
        }
        pBVar11 = this->binder;
        if (!bVar14) goto LAB_0119f64a;
        optional_ptr<duckdb::DummyBinding,_true>::CheckValid(&pBVar11->macro_binding);
        pCVar13 = local_1d8;
        pDVar4 = (pBVar11->macro_binding).ptr;
        (*(pDVar4->super_Binding)._vptr_Binding[3])(local_1d0,pDVar4,local_1d8,depth);
        auVar12 = local_1d0;
        local_1d0 = (undefined1  [8])0x0;
        _Var5.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (__return_storage_ptr__->expression).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)auVar12;
        if (_Var5.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (Expression *)0x0) {
          (**(code **)(*(long *)_Var5.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                _M_head_impl + 8))();
        }
        peVar2 = local_1c8;
        (__return_storage_ptr__->error).initialized = local_1c8._0_1_;
        (__return_storage_ptr__->error).type = local_1c8._1_1_;
        local_1c8 = peVar2;
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).raw_message,
                   (string *)local_1c0._M_local_buf);
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).final_message,(string *)&local_1a0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&(__return_storage_ptr__->error).extra_info,local_180);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p);
      }
      if ((Val *)local_1c0._M_allocated_capacity != &local_1b0) {
        operator_delete((void *)local_1c0._M_allocated_capacity);
      }
      if (local_1d0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1d0 + 8))();
      }
      if ((__return_storage_ptr__->error).initialized == true) {
        ErrorData::AddQueryLocation
                  (&__return_storage_ptr__->error,&col_ref_p->super_ParsedExpression);
        goto LAB_0119f76d;
      }
      local_1d0 = (undefined1  [8])&local_1c0;
      local_1c8 = (element_type *)0x0;
      local_1c0._M_allocated_capacity = local_1c0._M_allocated_capacity & 0xffffffffffffff00;
      local_1b0.bigint = -1;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::back(&pCVar13->column_names);
      ::std::__cxx11::string::_M_assign((string *)local_1d0);
      local_1b0.bigint = (pCVar13->super_ParsedExpression).super_BaseExpression.query_location.index
      ;
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      emplace_back<duckdb::BoundColumnReferenceInfo>
                (&(this->bound_columns).
                  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                 ,(BoundColumnReferenceInfo *)local_1d0);
    }
    else {
      pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&local_1f0);
      local_1d0 = (undefined1  [8])&local_1c0;
      pcVar3 = (pPVar8->super_BaseExpression).alias._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,pcVar3,
                 pcVar3 + (pPVar8->super_BaseExpression).alias._M_string_length);
      (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_1f0,depth,0);
      if ((Expression *)
          (__return_storage_ptr__->expression).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&__return_storage_ptr__->expression);
        ::std::__cxx11::string::operator=
                  ((string *)&(pEVar10->super_BaseExpression).alias,(string *)local_1d0);
      }
    }
    auVar12 = local_1d0;
    if (local_1d0 == (undefined1  [8])&local_1c0) goto LAB_0119f76d;
  }
  operator_delete((void *)auVar12);
LAB_0119f76d:
  if (local_1f0._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_1f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_130 + 0x48));
  if ((undefined1 *)local_130._40_8_ != local_130 + 0x38) {
    operator_delete((void *)local_130._40_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_130 + 0x18)) {
    operator_delete((void *)local_130._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(ColumnRefExpression &col_ref_p, idx_t depth, bool root_expression) {
	if (binder.GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		return BindResult(make_uniq<BoundConstantExpression>(Value(LogicalType::SQLNULL)));
	}

	ErrorData error;
	auto expr = QualifyColumnName(col_ref_p, error);
	if (!expr) {
		if (!col_ref_p.IsQualified()) {
			// column was not found
			// first try to bind it as an alias
			BindResult alias_result;
			auto found_alias = TryBindAlias(col_ref_p, root_expression, alias_result);
			if (found_alias) {
				return alias_result;
			}
			found_alias = QualifyColumnAlias(col_ref_p);
			if (!found_alias) {
				// column was not found - check if it is a SQL value function
				auto value_function = GetSQLValueFunction(col_ref_p.GetColumnName());
				if (value_function) {
					return BindExpression(value_function, depth);
				}
			}
		}
		error.AddQueryLocation(col_ref_p);
		return BindResult(std::move(error));
	}

	expr->SetQueryLocation(col_ref_p.GetQueryLocation());

	// the above QualifyColumName returns a generated expression for a generated
	// column, and struct_extract for a struct, or a lambda reference expression,
	// all of them are not column reference expressions, so we return here
	if (expr->GetExpressionType() != ExpressionType::COLUMN_REF) {
		auto alias = expr->GetAlias();
		auto result = BindExpression(expr, depth);
		if (result.expression) {
			result.expression->SetAlias(std::move(alias));
		}
		return result;
	}

	// the above QualifyColumnName returned an individual column reference
	// expression, which we resolve to either a base table or a subquery expression,
	// and if it was a macro parameter, then we let macro_binding bind it to the argument
	BindResult result;
	auto &col_ref = expr->Cast<ColumnRefExpression>();
	D_ASSERT(col_ref.IsQualified());
	auto &table_name = col_ref.GetTableName();

	if (binder.macro_binding && table_name == binder.macro_binding->GetAlias()) {
		result = binder.macro_binding->Bind(col_ref, depth);
	} else {
		result = binder.bind_context.BindColumn(col_ref, depth);
	}

	if (result.HasError()) {
		result.error.AddQueryLocation(col_ref_p);
		return result;
	}

	// we bound the column reference
	BoundColumnReferenceInfo ref;
	ref.name = col_ref.column_names.back();
	ref.query_location = col_ref.GetQueryLocation();
	bound_columns.push_back(std::move(ref));
	return result;
}